

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Coap::AddResource
          (Error *__return_storage_ptr__,Coap *this,Resource *aResource)

{
  bool bVar1;
  string *psVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_152;
  v10 local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  char *local_148;
  string local_140;
  Error local_120;
  _Self local_f8 [3];
  _Self local_e0;
  iterator res;
  Resource *aResource_local;
  Coap *this_local;
  Error *error;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  Error **local_50;
  undefined1 *local_48;
  Error **local_40;
  Error **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char *pcStack_10;
  
  res._M_node._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  psVar2 = Resource::GetUriPath_abi_cxx11_(aResource);
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
       ::find(&this->mResources,psVar2);
  local_f8[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
       ::end(&this->mResources);
  bVar1 = std::operator!=(&local_e0,local_f8);
  if (bVar1) {
    AddResource::anon_class_1_0_00000001::operator()(&local_152);
    local_58 = &local_150;
    local_60 = &local_151;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_148 = (char *)bVar3.size_;
    local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_80 = Resource::GetUriPath_abi_cxx11_(aResource);
    local_68 = &local_140;
    local_78 = local_150;
    pcStack_70 = local_148;
    local_20 = &local_78;
    local_90 = local_150;
    local_88 = local_148;
    local_18 = local_90;
    pcStack_10 = local_88;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_80,(v10 *)local_68,local_150);
    local_48 = local_a0;
    local_50 = &error;
    local_30 = 0xd;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_50;
    fmt.size_ = 0xd;
    fmt.data_ = local_88;
    local_40 = local_50;
    local_38 = local_50;
    local_28 = local_48;
    ::fmt::v10::vformat_abi_cxx11_(&local_140,(v10 *)local_90,fmt,args);
    Error::Error(&local_120,kAlreadyExists,&local_140);
    Error::operator=(__return_storage_ptr__,&local_120);
    Error::~Error(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    psVar2 = Resource::GetUriPath_abi_cxx11_(aResource);
    std::
    map<std::__cxx11::string,ot::commissioner::coap::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>>
    ::emplace<std::__cxx11::string_const&,ot::commissioner::coap::Resource_const&>
              ((map<std::__cxx11::string,ot::commissioner::coap::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>>
                *)&this->mResources,psVar2,aResource);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Coap::AddResource(const Resource &aResource)
{
    Error error;
    auto  res = mResources.find(aResource.GetUriPath());

    if (res != mResources.end())
    {
        ExitNow(error = ERROR_ALREADY_EXISTS("CoAP resource {} already exists", aResource.GetUriPath()));
    }
    mResources.emplace(aResource.GetUriPath(), aResource);

exit:
    return error;
}